

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::CommonCore::receive(CommonCore *this,InterfaceHandle destination)

{
  FederateStates FVar1;
  FederateState *this_00;
  InvalidIdentifier *this_01;
  InterfaceHandle in_EDX;
  undefined4 in_register_00000034;
  string_view message;
  
  this_00 = getHandleFederate((CommonCore *)CONCAT44(in_register_00000034,destination.hid),in_EDX);
  if (this_00 != (FederateState *)0x0) {
    FVar1 = FederateState::getState(this_00);
    if (FVar1 == EXECUTING) {
      FederateState::receive((FederateState *)this,(InterfaceHandle)(BaseType)this_00);
    }
    else {
      (this->super_Core)._vptr_Core = (_func_int **)0x0;
    }
    return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
           (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
  }
  this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
  message._M_str = "invalid handle";
  message._M_len = 0xe;
  InvalidIdentifier::InvalidIdentifier(this_01,message);
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

std::unique_ptr<Message> CommonCore::receive(InterfaceHandle destination)
{
    auto* fed = getHandleFederate(destination);
    if (fed == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }
    if (fed->getState() != FederateStates::EXECUTING) {
        return nullptr;
    }

    return fed->receive(destination);
}